

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void __thiscall
gguf_kv::gguf_kv<signed_char>
          (gguf_kv *this,string *key,vector<signed_char,_std::allocator<signed_char>_> *value)

{
  pointer pcVar1;
  pointer pcVar2;
  ulong uVar3;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  this->is_array = true;
  this->type = GGUF_TYPE_INT8;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (key->_M_string_length != 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (&this->data,
               (long)(value->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(value->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
    pcVar2 = (value->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((value->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != pcVar2) {
      uVar3 = 0;
      do {
        (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = pcVar2[uVar3];
        uVar3 = uVar3 + 1;
        pcVar2 = (value->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(value->
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2));
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x8c,"GGML_ASSERT(%s) failed","!key.empty()");
}

Assistant:

gguf_kv(const std::string & key, const std::vector<T> & value)
            : key(key), is_array(true), type(type_to_gguf_type<T>::value) {
        GGML_ASSERT(!key.empty());
        data.resize(value.size()*sizeof(T));
        for (size_t i = 0; i < value.size(); ++i) {
            const T tmp = value[i];
            memcpy(data.data() + i*sizeof(T), &tmp, sizeof(T));
        }
    }